

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void DnsStats::GetSourceAddress(int ip_type,uint8_t *ip_header,uint8_t **addr,size_t *addr_length)

{
  size_t *addr_length_local;
  uint8_t **addr_local;
  uint8_t *ip_header_local;
  int ip_type_local;
  
  if (ip_type == 4) {
    *addr = ip_header + 0xc;
    *addr_length = 4;
  }
  else {
    *addr = ip_header + 8;
    *addr_length = 0x10;
  }
  return;
}

Assistant:

void DnsStats::GetSourceAddress(int ip_type, uint8_t * ip_header, uint8_t ** addr, size_t * addr_length)
{
    if (ip_type == 4)
    {
        *addr = ip_header + 12;
        *addr_length = 4;
    }
    else
    {
        *addr = ip_header + 8;
        *addr_length = 16;
    }
}